

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O3

WirehairResult __thiscall
wirehair::Codec::ReconstructBlock(Codec *this,uint16_t block_id,void *block_out,uint32_t *bytes_out)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint32_t bytes;
  uint8_t *puVar4;
  WirehairResult WVar5;
  uint uVar6;
  Codec *pCVar7;
  uint uVar8;
  uint uVar9;
  short sVar10;
  ulong uVar11;
  PeelRow *pPVar12;
  uint i;
  long lVar13;
  uint uVar14;
  uint uVar15;
  PeelRowParameters params;
  ushort auStack_4e [3];
  uint32_t *local_48;
  PeelRowParameters local_3a;
  
  if ((block_out == (void *)0x0) || (uVar1 = this->_block_count, uVar1 <= block_id)) {
    *bytes_out = 0;
    WVar5 = Wirehair_InvalidInput;
  }
  else if (this->_all_original == true) {
    WVar5 = Wirehair_Error;
    if ((ulong)this->_row_count != 0) {
      pPVar12 = this->_peel_rows;
      uVar11 = 0;
      do {
        if (pPVar12->RecoveryId == (uint)block_id) {
          pCVar7 = (Codec *)&this->_output_final_bytes;
          if (uVar1 - 1 != (uint)block_id) {
            pCVar7 = this;
          }
          uVar6 = pCVar7->_block_bytes;
          memcpy(block_out,this->_input_blocks + (int)uVar11 * this->_block_bytes,(ulong)uVar6);
          *bytes_out = uVar6;
          goto LAB_001073e0;
        }
        uVar11 = uVar11 + 1;
        pPVar12 = pPVar12 + 1;
      } while (this->_row_count != uVar11);
    }
  }
  else {
    pCVar7 = (Codec *)&this->_output_final_bytes;
    if (uVar1 - 1 != (uint)block_id) {
      pCVar7 = this;
    }
    bytes = pCVar7->_block_bytes;
    local_48 = bytes_out;
    PeelRowParameters::Initialize(&local_3a,(uint)block_id,this->_p_seed,uVar1,this->_mix_count);
    uVar9 = (uint)local_3a.MixFirst;
    uVar1 = this->_block_next_prime;
    uVar15 = (uint)local_3a.PeelAdd;
    uVar2 = this->_mix_count;
    uVar3 = this->_mix_next_prime;
    lVar13 = 1;
    uVar6 = (uint)this->_block_count;
    do {
      uVar9 = ((uVar9 & 0xffff) + (uint)local_3a.MixAdd) % (uint)uVar3;
      if (uVar2 <= uVar9) {
        uVar9 = uVar3 - uVar9;
        uVar14 = uVar9 & 0xffff;
        if (local_3a.MixAdd < (ushort)uVar9) {
          uVar9 = ((uint)local_3a.MixAdd * 0x10000 - uVar14) % (uint)local_3a.MixAdd;
        }
        else {
          uVar9 = local_3a.MixAdd - uVar14;
        }
      }
      auStack_4e[lVar13] = (ushort)uVar9;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    uVar9 = this->_block_bytes;
    puVar4 = this->_recovery_blocks;
    if (local_3a.PeelCount == 1) {
      gf256_addset_mem(block_out,puVar4 + uVar9 * local_3a.PeelFirst,
                       puVar4 + uVar9 * (local_3a.MixFirst + uVar6),bytes);
    }
    else {
      sVar10 = local_3a.PeelCount - 2;
      uVar11 = (ulong)((uint)local_3a.PeelFirst + (uint)local_3a.PeelAdd) % (ulong)uVar1;
      if (uVar6 <= (uint)uVar11) {
        uVar14 = (uint)uVar1 - (uint)uVar11;
        uVar8 = uVar14 & 0xffff;
        if (local_3a.PeelAdd < (ushort)uVar14) {
          uVar11 = (ulong)(uVar15 * 0x10000 - uVar8) % (ulong)uVar15;
        }
        else {
          uVar11 = (ulong)(local_3a.PeelAdd - uVar8);
        }
      }
      gf256_addset_mem(block_out,puVar4 + uVar9 * local_3a.PeelFirst,
                       puVar4 + uVar9 * ((uint)uVar11 & 0xffff),bytes);
      if (sVar10 != 0) {
        do {
          uVar11 = (ulong)(((uint)uVar11 & 0xffff) + uVar15) % (ulong)uVar1;
          if (uVar6 <= (uint)uVar11) {
            uVar9 = (uint)uVar1 - (uint)uVar11;
            uVar14 = uVar9 & 0xffff;
            if (local_3a.PeelAdd < (ushort)uVar9) {
              uVar11 = (ulong)(uVar15 * 0x10000 - uVar14) % (ulong)uVar15;
            }
            else {
              uVar11 = (ulong)(uVar15 - uVar14);
            }
          }
          sVar10 = sVar10 + -1;
          gf256_add_mem(block_out,
                        this->_recovery_blocks + ((uint)uVar11 & 0xffff) * this->_block_bytes,bytes)
          ;
        } while (sVar10 != 0);
      }
      gf256_add_mem(block_out,
                    this->_recovery_blocks +
                    ((uint)this->_block_count + (uint)local_3a.MixFirst) * this->_block_bytes,bytes)
      ;
    }
    gf256_add2_mem(block_out,
                   this->_recovery_blocks +
                   ((uint)auStack_4e[1] + (uint)this->_block_count) * this->_block_bytes,
                   this->_recovery_blocks +
                   ((uint)auStack_4e[2] + (uint)this->_block_count) * this->_block_bytes,bytes);
    *local_48 = bytes;
LAB_001073e0:
    WVar5 = Wirehair_Success;
  }
  return WVar5;
}

Assistant:

WirehairResult Codec::ReconstructBlock(
    const uint16_t block_id, ///< Block identifier
    void * GF256_RESTRICT block_out, ///< Output block memory
    uint32_t* bytes_out ///< Bytes written to output
)
{
    CAT_IF_DUMP(cout << endl << "---- ReconstructBlock ----" << endl << endl;)

    // Validate input
    if (!block_out || block_id >= _block_count)
    {
        *bytes_out = 0;
        return Wirehair_InvalidInput;
    }

#if defined(CAT_ALL_ORIGINAL)
    // If decoder received only original data out of order:
    if (_all_original)
    {
        PeelRow * GF256_RESTRICT row = _peel_rows;
        const uint8_t * GF256_RESTRICT src = _input_blocks;

        // For each row that was received:
        for (uint16_t row_i = 0, count = _row_count; row_i < count; ++row_i)
        {
            const uint32_t id = row[row_i].RecoveryId;

            // If this is the id we seek:
            if (id == block_id)
            {
                CAT_IF_DUMP(cout << "Copying received row " << id << endl;)

                const unsigned bytes = (id != (unsigned)_block_count - 1) ? _block_bytes : _output_final_bytes;

                memcpy(block_out, src + row_i * _block_bytes, bytes);

                *bytes_out = (uint32_t)bytes;

                return Wirehair_Success;
            }
        }

        return Wirehair_Error;
    }
#endif

    // Regenerate any single row that got lost:

    uint32_t block_bytes = _block_bytes;

    // For last row, use final byte count
    if (block_id == _block_count - 1) {
        block_bytes = _output_final_bytes;
    }

    CAT_IF_DUMP(cout << "Regenerating row " << block_id << ":";)

    PeelRowParameters params;
    params.Initialize(block_id, _p_seed, _block_count, _mix_count);

    PeelRowIterator iter(params, _block_count, _block_next_prime);
    const RowMixIterator mix(params, _mix_count, _mix_next_prime);

    const uint16_t peel_0 = iter.GetColumn();

    // Remember first column (there is always at least one)
    CAT_DEBUG_ASSERT(peel_0 < _recovery_rows);
    uint8_t * GF256_RESTRICT first = _recovery_blocks + _block_bytes * peel_0;

    CAT_IF_DUMP(cout << " " << peel_0;)

    // If this row references multiple columns:
    if (iter.Iterate())
    {
        const uint16_t peel_1 = iter.GetColumn();

        CAT_IF_DUMP(cout << " " << peel_1;)

        CAT_DEBUG_ASSERT(peel_1 < _recovery_rows);

        // Combine first two columns into output buffer (faster than memcpy + memxor)
        gf256_addset_mem(
            block_out,
            first,
            _recovery_blocks + _block_bytes * peel_1,
            block_bytes);

        // For each remaining peeler column:
        while (iter.Iterate())
        {
            const uint16_t peel_x = iter.GetColumn();

            CAT_IF_DUMP(cout << " " << peel_x;)

            CAT_DEBUG_ASSERT(peel_x < _recovery_rows);

            // Mix in each column
            gf256_add_mem(
                block_out,
                _recovery_blocks + _block_bytes * peel_x,
                block_bytes);
        }

        CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[0]) < _recovery_rows);

        // Mix first mixer block in directly
        gf256_add_mem(
            block_out,
            _recovery_blocks + _block_bytes * (_block_count + mix.Columns[0]),
            block_bytes);
    }
    else
    {
        CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[0]) < _recovery_rows);

        // Mix first with first mixer block (faster than memcpy + memxor)
        gf256_addset_mem(
            block_out,
            first,
            _recovery_blocks + _block_bytes * (_block_count + mix.Columns[0]),
            block_bytes);
    }

    CAT_IF_DUMP(cout << " " << (_block_count + mix.Columns[0]);)

    // Combine remaining two mixer columns together:
    CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[1]) < _recovery_rows);
    const uint8_t * mix0_src = _recovery_blocks + _block_bytes * (_block_count + mix.Columns[1]);
    CAT_IF_DUMP(cout << " " << (_block_count + mix.Columns[1]);)

    CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[2]) < _recovery_rows);
    const uint8_t * mix1_src = _recovery_blocks + _block_bytes * (_block_count + mix.Columns[2]);
    CAT_IF_DUMP(cout << " " << (_block_count + mix.Columns[2]);)

    gf256_add2_mem(block_out, mix0_src, mix1_src, block_bytes);

    CAT_IF_DUMP(cout << endl;)

    *bytes_out = static_cast<uint32_t>(block_bytes);
    return Wirehair_Success;
}